

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManDeriveReason(Cbs2_Man_t *p,int Level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Cbs2_Que_t *p_00;
  int *piVar4;
  int nLits;
  int *pLits;
  int i_1;
  int *pReason;
  int iLitLevel;
  int iObj;
  int k;
  int i;
  Cbs2_Que_t *pQue;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  p_00 = &p->pClauses;
  if ((p->pClauses).pData[p_00->iHead] != 0) {
    __assert_fail("pQue->pData[pQue->iHead] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d4,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if ((p->pClauses).pData[p_00->iHead + 1] != 0) {
    __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d5,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  if ((p->pClauses).iTail <= p_00->iHead + 2) {
    __assert_fail("pQue->iHead + 2 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x2d6,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
  }
  Vec_IntClear(p->vTemp);
  iLitLevel = p_00->iHead + 2;
  iObj = iLitLevel;
  do {
    if ((p->pClauses).iTail <= iObj) {
      if ((p->pClauses).pData[p_00->iHead] != 0) {
        __assert_fail("pQue->pData[pQue->iHead] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x305,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
      }
      if ((p->pClauses).pData[p_00->iHead + 1] != 0) {
        (p->pClauses).iTail = iLitLevel;
        for (iObj = 0; iVar3 = Vec_IntSize(p->vTemp), iObj < iVar3; iObj = iObj + 1) {
          iVar3 = Vec_IntEntry(p->vTemp,iObj);
          Cbs2_VarSetMark0(p,iVar3,0);
        }
        iVar3 = Cbs2_QueFinish(p,Level);
        return iVar3;
      }
      __assert_fail("pQue->pData[pQue->iHead+1] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x306,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
    }
    iVar3 = (p->pClauses).pData[iObj];
    iVar1 = Cbs2_VarMark0(p,iVar3);
    if (iVar1 == 0) {
      Cbs2_VarSetMark0(p,iVar3,1);
      Vec_IntPush(p->vTemp,iVar3);
      iVar1 = Cbs2_VarDecLevel(p,iVar3);
      if (iVar1 < Level) {
        (p->pClauses).pData[iLitLevel] = iVar3;
        iLitLevel = iLitLevel + 1;
      }
      else {
        if (iVar1 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x2ed,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
        }
        piVar4 = Cbs2_VarReasonP(p,iVar3);
        if ((*piVar4 == 0) && (piVar4[1] == 0)) {
          if ((p->pClauses).pData[p_00->iHead + 1] != 0) {
            __assert_fail("pQue->pData[pQue->iHead+1] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x2f1,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
          }
          (p->pClauses).pData[p_00->iHead + 1] = iVar3;
        }
        else if (*piVar4 == 0) {
          iVar1 = Cbs2_ClauseSize(p,piVar4[1]);
          if (piVar4[1] == 0) {
            __assert_fail("pReason[1]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x2fd,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
          }
          Cbs2_QueGrow(p_00,iVar1);
          piVar4 = Cbs2_ClauseLits(p,piVar4[1]);
          iVar2 = Abc_Lit2Var(*piVar4);
          if (iVar3 != iVar2) {
            __assert_fail("iObj == Abc_Lit2Var(pLits[0])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x300,"int Cbs2_ManDeriveReason(Cbs2_Man_t *, int)");
          }
          for (pLits._4_4_ = 1; pLits._4_4_ < iVar1; pLits._4_4_ = pLits._4_4_ + 1) {
            iVar3 = Abc_Lit2Var(piVar4[pLits._4_4_]);
            Cbs2_QuePush(p_00,iVar3);
          }
        }
        else {
          Cbs2_QuePush(p_00,*piVar4);
          if (piVar4[1] != 0) {
            Cbs2_QuePush(p_00,piVar4[1]);
          }
        }
      }
    }
    iObj = iObj + 1;
  } while( true );
}

Assistant:

static inline int Cbs2_ManDeriveReason( Cbs2_Man_t * p, int Level )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, k, iObj, iLitLevel, * pReason;
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] == 0 );
    assert( pQue->iHead + 2 < pQue->iTail );
    //for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
    //    assert( !Cbs2_VarMark0(p, pQue->pData[i]) );
    // compact literals
    Vec_IntClear( p->vTemp );
    for ( i = k = pQue->iHead + 2; i < pQue->iTail; i++ )
    {
        iObj = pQue->pData[i];
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Vec_IntPush( p->vTemp, iObj );
        // check decision level
        iLitLevel = Cbs2_VarDecLevel( p, iObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = iObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs2_VarReasonP( p, iObj );
        if ( pReason[0] == 0 && pReason[1] == 0 ) // no reason
        {
            assert( pQue->pData[pQue->iHead+1] == 0 );
            pQue->pData[pQue->iHead+1] = iObj;
        }
        else if ( pReason[0] != 0 ) // circuit reason
        {
            Cbs2_QuePush( pQue, pReason[0] );
            if ( pReason[1] )
            Cbs2_QuePush( pQue, pReason[1] );
        }
        else // clause reason
        {
            int i, * pLits, nLits = Cbs2_ClauseSize( p, pReason[1] );
            assert( pReason[1] );
            Cbs2_QueGrow( pQue, nLits );
            pLits = Cbs2_ClauseLits( p, pReason[1] );
            assert( iObj == Abc_Lit2Var(pLits[0]) );
            for ( i = 1; i < nLits; i++ )
                Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
        }
    }
    assert( pQue->pData[pQue->iHead] == 0 );
    assert( pQue->pData[pQue->iHead+1] != 0 );
    pQue->iTail = k;
    // clear the marks
    Vec_IntForEachEntry( p->vTemp, iObj, i )
        Cbs2_VarSetMark0(p, iObj, 0);
    return Cbs2_QueFinish( p, Level );
}